

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O3

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  pointer puVar1;
  Module *this_00;
  ostream *poVar2;
  Pass *pPVar3;
  PassRunner *pPVar4;
  PassRunner *pPVar5;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar6;
  bool bVar7;
  string_view sVar8;
  Name name_00;
  undefined1 local_218 [8];
  PassRunner postRunner;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_90;
  bool local_70;
  string local_68;
  Module *local_48;
  Module *local_40;
  PassRunner *local_38;
  
  pPVar4 = name.super_IString.str._M_len;
  pPVar5 = pPVar4;
  local_38 = (PassRunner *)this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"extracting ",0xb);
  name_00.super_IString.str._M_str = (char *)pPVar5;
  name_00.super_IString.str._M_len = (size_t)pPVar4;
  local_40 = module;
  poVar2 = operator<<((wasm *)&std::cerr,(ostream *)module,name_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  puVar6 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = (Module *)runner;
  if (puVar6 == puVar1) {
LAB_0085c690:
    Fatal::Fatal((Fatal *)local_218);
    Fatal::operator<<((Fatal *)local_218,(char (*) [40])"could not find the function to extract\n");
    Fatal::~Fatal((Fatal *)local_218);
  }
  bVar7 = false;
  do {
    while (((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->runner == pPVar4) {
      puVar6 = puVar6 + 1;
      bVar7 = true;
      if (puVar6 == puVar1) {
LAB_0085c579:
        this_00 = local_48;
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::_M_erase_at_end(&local_48->exports,
                          (local_48->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        Module::updateMaps(this_00);
        local_218 = (undefined1  [8])operator_new(0x30);
        *(Module **)
         &(((Export *)local_218)->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u = local_40;
        *(PassRunner **)
         ((long)&(((Export *)local_218)->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) = pPVar4;
        (((Export *)local_218)->name).super_IString.str._M_len = (size_t)local_40;
        (((Export *)local_218)->name).super_IString.str._M_str = (char *)pPVar4;
        ((Export *)local_218)->kind = Function;
        *(__index_type *)
         ((long)&(((Export *)local_218)->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = '\0';
        Module::addExport(this_00,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                                  local_218);
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218,0x30);
        }
        PassRunner::PassRunner((PassRunner *)local_218,local_38);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"remove-unused-module-elements","");
        local_70 = false;
        PassRunner::add((PassRunner *)local_218,&local_68,
                        (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_90);
        if ((local_70 == true) &&
           (local_70 = false,
           local_90._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_90._M_value + 0x10))) {
          operator_delete((void *)local_90._M_value._M_dataplus._M_p,local_90._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        PassRunner::run((PassRunner *)local_218);
        PassRunner::~PassRunner((PassRunner *)local_218);
        return;
      }
    }
    sVar8 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xdb5fc0),SUB81(pPVar5,0));
    *(string_view *)
     &(((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length = sVar8;
    pPVar3 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
             .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    pPVar5 = pPVar3->runner;
    *(_func_int ***)((long)&(pPVar3->name).field_2 + 8) = pPVar3->_vptr_Pass;
    *(PassRunner **)
     &(pPVar3->passArg).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload = pPVar5;
    pPVar3 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
             .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    pPVar5 = *(PassRunner **)
              ((long)&(pPVar3->passArg).
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              + 0x18);
    if (*(PassRunner **)
         ((long)&(pPVar3->passArg).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         + 0x20) != pPVar5) {
      *(PassRunner **)
       ((long)&(pPVar3->passArg).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       + 0x20) = pPVar5;
      pPVar3 = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    }
    pPVar3[1].runner = (PassRunner *)0x0;
    puVar6 = puVar6 + 1;
  } while (puVar6 != puVar1);
  if (!bVar7) goto LAB_0085c690;
  goto LAB_0085c579;
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}